

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestCaseStart(StreamingListener *this,TestCase *test_case)

{
  string local_48;
  String local_28;
  
  String::Format(&local_28,"event=TestCaseStart&name=%s\n",(test_case->name_).c_str_);
  String::operator_cast_to_string(&local_48,&local_28);
  Send(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  String::~String(&local_28);
  return;
}

Assistant:

void OnTestCaseStart(const TestCase& test_case) {
    Send(String::Format("event=TestCaseStart&name=%s\n", test_case.name()));
  }